

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

TypedParam * solver_params_get_val(SolverTypedParams *params,char *key,ParamType type)

{
  TypedParam *pTVar1;
  char *pcVar2;
  char *pcVar3;
  TypedParam *p;
  ParamType type_local;
  char *key_local;
  SolverTypedParams *params_local;
  
  pTVar1 = solver_params_get_key(params,key);
  if (pTVar1 != (TypedParam *)0x0) {
    if (pTVar1->count < 1) {
      log_log(0x80,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
              ,0x211,"Internal error. Tryed to unpack key `%s`, but its count is <= 0     (%d).",key
              ,(ulong)(uint)pTVar1->count);
      abort();
    }
    if (pTVar1->type != type) {
      pcVar2 = param_type_as_str(type);
      pcVar3 = param_type_as_str(pTVar1->type);
      log_log(0x80,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
              ,0x217,
              "Internal error. Tryed to unpack key `%s` as type `%s`, but the actual type is `%s`.",
              key,pcVar2,pcVar3);
      abort();
    }
  }
  pcVar2 = param_type_as_str(type);
  log_log(0x20,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core.c"
          ,0x21e,"Getting parameter `%s` as type `%s`",key,pcVar2);
  return pTVar1;
}

Assistant:

static inline TypedParam *solver_params_get_val(SolverTypedParams *params,
                                                char *key, ParamType type) {
    TypedParam *p = solver_params_get_key(params, key);
    if (p) {
        if (p->count <= 0) {
            log_fatal(
                "Internal error. Tryed to unpack key `%s`, but its count is <= "
                "0     (%d).",
                key, p->count);

            abort();
        } else if (p->type != type) {
            log_fatal("Internal error. Tryed to unpack key `%s` as type `%s`, "
                      "but the actual type is `%s`.",
                      key, param_type_as_str(type), param_type_as_str(p->type));

            abort();
        }
    }

    log_info("Getting parameter `%s` as type `%s`", key,
             param_type_as_str(type));
    return p;
}